

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsnav.c
# Opt level: O0

void fsnav_free_gnss_gps(fsnav_gnss_gps *gps)

{
  fsnav_gnss_gps *gps_local;
  
  if (gps != (fsnav_gnss_gps *)0x0) {
    gps->cfg = (char *)0x0;
    gps->cfglength = 0;
    fsnav_free_gnss_sat(&gps->sat,gps->max_sat_count);
    gps->max_sat_count = 0;
    fsnav_free_null(&gps->obs_types);
    gps->obs_count = 0;
    free(gps);
  }
  return;
}

Assistant:

void fsnav_free_gnss_gps(fsnav_gnss_gps* gps)
{
	if (gps == NULL)
		return;
	
	//configuration
	gps->cfg = NULL;
	gps->cfglength = 0;
	
	// satellites
	fsnav_free_gnss_sat(&(gps->sat), gps->max_sat_count);
	gps->max_sat_count = 0;
	
	// observation types
	fsnav_free_null((void**)(&(gps->obs_types)));
	gps->obs_count = 0;
	
	// gnss_gps structure
	free((void*)gps);
}